

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiWindow * ImGui::GetTopMostAndVisiblePopupModal(void)

{
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *popup;
  int n;
  ImGuiContext *g;
  int local_14;
  
  pIVar1 = GImGui;
  local_14 = (GImGui->OpenPopupStack).Size;
  do {
    local_14 = local_14 + -1;
    if (local_14 < 0) {
      return (ImGuiWindow *)0x0;
    }
    window = (pIVar1->OpenPopupStack).Data[local_14].Window;
  } while (((window == (ImGuiWindow *)0x0) || ((window->Flags & 0x8000000U) == 0)) ||
          (bVar2 = IsWindowActiveAndVisible(window), !bVar2));
  return window;
}

Assistant:

ImGuiWindow* ImGui::GetTopMostAndVisiblePopupModal()
{
    ImGuiContext& g = *GImGui;
    for (int n = g.OpenPopupStack.Size - 1; n >= 0; n--)
        if (ImGuiWindow* popup = g.OpenPopupStack.Data[n].Window)
            if ((popup->Flags & ImGuiWindowFlags_Modal) && IsWindowActiveAndVisible(popup))
                return popup;
    return NULL;
}